

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O1

CURLcode ftp_state_rest_resp(Curl_easy *data,connectdata *conn,int ftpcode,ftpstate instate)

{
  ulong uVar1;
  CURLcode CVar2;
  size_t blen;
  undefined7 in_register_00000009;
  char buffer [24];
  char local_48 [32];
  
  if ((int)CONCAT71(in_register_00000009,instate) == 0x1b) {
    if (ftpcode == 0x15e) {
      CVar2 = Curl_pp_sendf(data,&(conn->proto).ftpc.pp,"RETR %s",(conn->proto).ftpc.file);
      if (CVar2 == CURLE_OK) {
        _ftp_state(data,' ');
        CVar2 = CURLE_OK;
      }
    }
    else {
      Curl_failf(data,"Couldn\'t use REST");
      CVar2 = CURLE_FTP_COULDNT_USE_REST;
    }
  }
  else {
    if (ftpcode == 0x15e) {
      builtin_strncpy(local_48,"Accept-ranges: bytes\r\n",0x17);
      local_48[0x17] = '\0';
      blen = strlen(local_48);
      uVar1 = *(ulong *)&(data->set).field_0x89c;
      *(ulong *)&(data->set).field_0x89c = uVar1 | 0x4000000;
      CVar2 = Curl_client_write(data,4,local_48,blen);
      *(ulong *)&(data->set).field_0x89c =
           *(ulong *)&(data->set).field_0x89c & 0xfffffffffbffffff | uVar1 & 0x4000000;
      if (CVar2 != CURLE_OK) {
        return CVar2;
      }
    }
    CVar2 = ftp_state_prepare_transfer(data);
  }
  return CVar2;
}

Assistant:

static CURLcode ftp_state_rest_resp(struct Curl_easy *data,
                                    struct connectdata *conn,
                                    int ftpcode,
                                    ftpstate instate)
{
  CURLcode result = CURLE_OK;
  struct ftp_conn *ftpc = &conn->proto.ftpc;

  switch(instate) {
  case FTP_REST:
  default:
#ifdef CURL_FTP_HTTPSTYLE_HEAD
    if(ftpcode == 350) {
      char buffer[24]= { "Accept-ranges: bytes\r\n" };
      result = client_write_header(data, buffer, strlen(buffer));
      if(result)
        return result;
    }
#endif
    result = ftp_state_prepare_transfer(data);
    break;

  case FTP_RETR_REST:
    if(ftpcode != 350) {
      failf(data, "Couldn't use REST");
      result = CURLE_FTP_COULDNT_USE_REST;
    }
    else {
      result = Curl_pp_sendf(data, &ftpc->pp, "RETR %s", ftpc->file);
      if(!result)
        ftp_state(data, FTP_RETR);
    }
    break;
  }

  return result;
}